

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_swrenderer.cpp
# Opt level: O1

void __thiscall
FSoftwareRenderer::WriteSavePic
          (FSoftwareRenderer *this,player_t *player,FileWriter *file,int width,int height)

{
  uint32 *puVar1;
  DSimpleCanvas *this_00;
  PalEntry palette [256];
  PalEntry local_428 [256];
  
  this_00 = (DSimpleCanvas *)
            M_Malloc_Dbg(0x50,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  DSimpleCanvas::DSimpleCanvas(this_00,width,height);
  puVar1 = &(this_00->super_DCanvas).super_DObject.ObjectFlags;
  *(byte *)puVar1 = (byte)*puVar1 | 8;
  (*(this_00->super_DCanvas).super_DObject._vptr_DObject[8])(this_00,1);
  swrenderer::R_RenderViewToCanvas
            (&player->mo->super_AActor,(DCanvas *)this_00,0,0,width,height,false);
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1b])(screen,local_428)
  ;
  M_CreatePNG(file,(this_00->super_DCanvas).Buffer,local_428,SS_PAL,width,height,
              (this_00->super_DCanvas).Pitch);
  (*(this_00->super_DCanvas).super_DObject._vptr_DObject[9])(this_00);
  (*(this_00->super_DCanvas).super_DObject._vptr_DObject[4])(this_00);
  puVar1 = &(this_00->super_DCanvas).super_DObject.ObjectFlags;
  *(byte *)puVar1 = (byte)*puVar1 | 0x80;
  (*(this_00->super_DCanvas).super_DObject._vptr_DObject[2])(this_00);
  return;
}

Assistant:

void FSoftwareRenderer::WriteSavePic (player_t *player, FileWriter *file, int width, int height)
{
	DCanvas *pic = new DSimpleCanvas (width, height);
	PalEntry palette[256];

	// Take a snapshot of the player's view
	pic->ObjectFlags |= OF_Fixed;
	pic->Lock ();
	R_RenderViewToCanvas (player->mo, pic, 0, 0, width, height);
	screen->GetFlashedPalette (palette);
	M_CreatePNG (file, pic->GetBuffer(), palette, SS_PAL, width, height, pic->GetPitch());
	pic->Unlock ();
	pic->Destroy();
	pic->ObjectFlags |= OF_YesReallyDelete;
	delete pic;
}